

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall json::Json::init(Json *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Node *A;
  Type TVar2;
  JsonError *pJVar3;
  allocator<char> local_51;
  Object local_50;
  
  if (*ctx != (EVP_PKEY_CTX)0x1) {
    pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"invalid format",&local_51);
    JsonError::JsonError(pJVar3,(string *)&local_50);
    __cxa_throw(pJVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)(ctx + 8) == 1) {
    A = *(Node **)(ctx + 0x10);
    iVar1 = (A->production).nonTerminal;
    if (iVar1 == 3) {
      createArray((Array *)&local_50,A);
      std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
      _M_move_assign(&(this->array).fields,&local_50.fields);
      Array::~Array((Array *)&local_50);
      TVar2 = IsArray;
    }
    else {
      if (iVar1 != 2) {
        pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"invalid format",&local_51);
        JsonError::JsonError(pJVar3,(string *)&local_50);
        __cxa_throw(pJVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
      }
      createObject(&local_50,A);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
      ::operator=(&(this->object).fields._M_t,&local_50.fields._M_t);
      Object::~Object(&local_50);
      TVar2 = IsObject;
    }
    this->type = TVar2;
    return TVar2;
  }
  pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"invalid format",&local_51)
  ;
  JsonError::JsonError(pJVar3,(string *)&local_50);
  __cxa_throw(pJVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(parser::Node const& J) {
            if (J.isProduction())
                if (rules::Json == J.getProduction().nonTerminal) {
                    parser::Node const& OorA = J.getProduction().nodes.front();
                    if (rules::Object == OorA.getProduction().nonTerminal) {
                        object = createObject(OorA);
                        type = IsObject;
                    } else if (rules::Array == OorA.getProduction().nonTerminal) {
                        array = createArray(OorA);
                        type = IsArray;
                    } else {
                        throw JsonError("invalid format");
                    }
                } else {
                    throw JsonError("invalid format");
                }
            else
                throw JsonError("invalid format");
        }